

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ImplicitEventControlSyntax::setChild
          (ImplicitEventControlSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00c768cc + *(int *)(&DAT_00c768cc + in_RSI * 4)))();
  return;
}

Assistant:

void ImplicitEventControlSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: at = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: star = child.token(); return;
        case 3: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}